

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthStencilTests.cpp
# Opt level: O0

void deqp::gles3::Functional::DepthStencilCaseUtil::translateCommand
               (RenderCommand *src,RefRenderCommand *dst,TestRenderTarget *renderTarget)

{
  TestFunc TVar1;
  byte local_4a;
  byte local_49;
  float local_48;
  int local_44;
  float local_40;
  Vector<int,_2> local_3c;
  Vector<int,_2> local_34;
  byte local_2b;
  byte local_2a;
  byte local_29;
  undefined4 local_28;
  bool isFrontFacing;
  bool hasStencil;
  undefined4 uStack_24;
  bool hasDepth;
  float near;
  float far;
  TestRenderTarget *renderTarget_local;
  RefRenderCommand *dst_local;
  RenderCommand *src_local;
  
  uStack_24 = 0x3f800000;
  local_28 = 0;
  local_29 = 0 < renderTarget->depthBits;
  local_2a = 0 < renderTarget->stencilBits;
  local_2b = (src->params).visibleFace == FACETYPE_FRONT;
  if ((bool)local_2b) {
    local_44 = (src->rect).left;
  }
  else {
    local_44 = (src->rect).left + (src->rect).width + -1;
  }
  _near = renderTarget;
  renderTarget_local = (TestRenderTarget *)dst;
  dst_local = (RefRenderCommand *)src;
  tcu::Vector<int,_2>::Vector(&local_34,local_44,(src->rect).bottom);
  renderTarget_local->width = local_34.m_data[0];
  renderTarget_local->height = local_34.m_data[1];
  if ((local_2b & 1) == 0) {
    local_48 = (dst_local->quad).color1[0].m_data[0];
  }
  else {
    local_48 = (float)((int)(dst_local->quad).color1[0].m_data[0] +
                       (int)(dst_local->quad).color1[0].m_data[2] + -1);
  }
  tcu::Vector<int,_2>::Vector
            (&local_3c,(int)local_48,
             (int)(dst_local->quad).color1[0].m_data[1] + (int)(dst_local->quad).color1[0].m_data[3]
             + -1);
  renderTarget_local->depthBits = local_3c.m_data[0];
  renderTarget_local->stencilBits = local_3c.m_data[1];
  std::fill<tcu::Vector<float,4>*,tcu::Vector<float,4>>
            ((Vector<float,_4> *)(renderTarget_local + 1),
             (Vector<float,_4> *)(renderTarget_local + 5),(dst_local->quad).color1 + 1);
  local_40 = (dst_local->quad).color[3].m_data[2] * 0.5 + 0.5;
  std::fill<float*,float>
            ((float *)(renderTarget_local + 9),(float *)(renderTarget_local + 10),&local_40);
  renderTarget_local[0x13].depthBits = (int)(dst_local->quad).color1[2].m_data[0];
  *(undefined1 *)&renderTarget_local[10].width = 0;
  local_49 = 0;
  if ((local_2a & 1) != 0) {
    local_49 = (byte)(dst_local->quad).posA.m_data[1];
  }
  *(byte *)&renderTarget_local[0xb].height = local_49 & 1;
  local_4a = 0;
  if ((local_29 & 1) != 0) {
    local_4a = *(byte *)(dst_local->quad).color[3].m_data;
  }
  *(byte *)&renderTarget_local[0xf].width = local_4a & 1;
  renderTarget_local[0xf].stencilBits = 0;
  renderTarget_local[0x13].stencilBits = _near->stencilBits;
  if ((renderTarget_local[0xf].width & 1) != 0) {
    TVar1 = sglr::rr_util::mapGLTestFunc((deUint32)(dst_local->quad).color[3].m_data[1]);
    renderTarget_local[0xf].height = TVar1;
    *(byte *)&renderTarget_local[0xf].depthBits =
         *(byte *)((dst_local->quad).color[3].m_data + 3) & 1;
  }
  if ((renderTarget_local[0xb].height & 1) != 0) {
    translateStencilState
              ((StencilParams *)((dst_local->quad).color[1].m_data + 1),
               (StencilState *)&renderTarget_local[0xd].height);
    translateStencilState
              ((StencilParams *)&(dst_local->quad).posB,
               (StencilState *)&renderTarget_local[0xb].depthBits);
  }
  return;
}

Assistant:

void translateCommand (const RenderCommand& src, RefRenderCommand& dst, const TestRenderTarget& renderTarget)
{
	const float		far				= 1.0f;
	const float		near			= 0.0f;
	bool			hasDepth		= renderTarget.depthBits > 0;
	bool			hasStencil		= renderTarget.stencilBits > 0;
	bool			isFrontFacing	= src.params.visibleFace == rr::FACETYPE_FRONT;

	dst.quad.posA = IVec2(isFrontFacing ? src.rect.left : (src.rect.left+src.rect.width-1), src.rect.bottom);
	dst.quad.posB = IVec2(isFrontFacing ? (src.rect.left+src.rect.width-1) : src.rect.left, src.rect.bottom+src.rect.height-1);

	std::fill(DE_ARRAY_BEGIN(dst.quad.color), DE_ARRAY_END(dst.quad.color), src.color);
	std::fill(DE_ARRAY_BEGIN(dst.quad.depth), DE_ARRAY_END(dst.quad.depth), ((far-near)/2.0f) * src.params.depth + (near+far)/2.0f);

	dst.state.colorMask = src.colorMask;

	dst.state.scissorTestEnabled		= false;
	dst.state.stencilTestEnabled		= hasStencil && src.params.stencilTestEnabled;
	dst.state.depthTestEnabled			= hasDepth && src.params.depthTestEnabled;
	dst.state.blendMode					= rr::BLENDMODE_NONE;
	dst.state.numStencilBits			= renderTarget.stencilBits;

	if (dst.state.depthTestEnabled)
	{
		dst.state.depthFunc					= sglr::rr_util::mapGLTestFunc(src.params.depthFunc);
		dst.state.depthMask					= src.params.depthWriteMask;
	}

	if (dst.state.stencilTestEnabled)
	{
		translateStencilState(src.params.stencil[rr::FACETYPE_BACK],	dst.state.stencilStates[rr::FACETYPE_BACK]);
		translateStencilState(src.params.stencil[rr::FACETYPE_FRONT],	dst.state.stencilStates[rr::FACETYPE_FRONT]);
	}
}